

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O3

void make_pair(stream_socket *s1,stream_socket *s2)

{
  acceptor a;
  endpoint local_70 [8];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  acceptor local_48 [48];
  
  booster::aio::acceptor::acceptor(local_48);
  booster::aio::acceptor::open(local_48,1);
  booster::aio::basic_socket::set_option(local_48,2,1);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"127.0.0.1","");
  booster::aio::endpoint::endpoint(local_70,(string *)local_68,0);
  booster::aio::acceptor::bind((endpoint *)local_48);
  booster::aio::endpoint::~endpoint(local_70);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  booster::aio::acceptor::listen((int)local_48);
  booster::aio::stream_socket::open(s1,1);
  booster::aio::basic_socket::local_endpoint();
  booster::aio::stream_socket::connect((endpoint *)s1);
  booster::aio::endpoint::~endpoint((endpoint *)local_68);
  booster::aio::acceptor::accept((stream_socket *)local_48);
  booster::aio::basic_io_device::close();
  booster::aio::acceptor::~acceptor(local_48);
  return;
}

Assistant:

void make_pair(io::stream_socket &s1,io::stream_socket &s2)
{
	io::acceptor a;
	a.open(io::pf_inet);
    #ifndef BOOSTER_WIN32
	a.set_option(io::stream_socket::reuse_address,true);
    #endif
	a.bind(io::endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(io::pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
}